

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O3

Vec_Wec_t * Abc_ExorcismNtk2Esop(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  size_t __size;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  int *piVar8;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Abc_Obj_t *pAVar13;
  long lVar14;
  int Entry;
  Vec_Int_t *pVVar15;
  long lVar16;
  uint uVar17;
  char *pcVar18;
  Vec_Int_t *local_68;
  
  pVVar5 = pNtk->vCis;
  pVVar7 = pNtk->vCos;
  iVar2 = pVVar5->nSize;
  if (pVVar7->nSize < 1) {
    uVar17 = 0;
    iVar3 = iVar2;
  }
  else {
    lVar16 = 0;
    uVar17 = 0;
    do {
      pAVar13 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar7->pArray[lVar16] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar7->pArray[lVar16] + 0x20) * 8);
      if (pAVar13->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar13 = (Abc_Obj_t *)pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanins).pArray];
      }
      uVar4 = 1;
      if ((*(uint *)&pAVar13->field_0x14 & 0xf) == 7) {
        iVar3 = Abc_NodeIsConst(pAVar13);
        if (iVar3 == 0) {
          uVar4 = Abc_SopGetCubeNum((char *)(pAVar13->field_5).pData);
        }
        else {
          iVar3 = Abc_NodeIsConst1(pAVar13);
          uVar4 = (uint)(iVar3 != 0);
        }
      }
      uVar17 = uVar17 + uVar4;
      lVar16 = lVar16 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar16 < pVVar7->nSize);
    pVVar5 = pNtk->vCis;
    iVar3 = pVVar5->nSize;
  }
  if (0 < iVar3) {
    lVar16 = 0;
    do {
      *(long *)((long)pVVar5->pArray[lVar16] + 0x40) = lVar16;
      lVar16 = lVar16 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar16 < pVVar5->nSize);
  }
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar17) {
    uVar4 = uVar17 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar4;
  if (uVar4 == 0) {
    local_68 = (Vec_Int_t *)0x0;
  }
  else {
    local_68 = (Vec_Int_t *)calloc((long)(int)uVar4,0x10);
  }
  pVVar6->pArray = local_68;
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    __size = (long)iVar2 * 4 + 8;
    uVar17 = 0;
    lVar16 = 0;
    do {
      pAVar13 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar7->pArray[lVar16] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar7->pArray[lVar16] + 0x20) * 8);
      if (pAVar13->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar13 = (Abc_Obj_t *)pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanins).pArray];
      }
      iVar3 = Abc_NodeIsConst(pAVar13);
      if ((iVar3 == 0) && (pcVar18 = (char *)(pAVar13->field_5).pData, *pcVar18 != '\0')) {
        lVar10 = (long)(pAVar13->vFanins).nSize + 3;
        uVar11 = uVar17;
        do {
          if (uVar11 == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (local_68 == (Vec_Int_t *)0x0) {
                local_68 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                local_68 = (Vec_Int_t *)realloc(local_68,0x100);
              }
              pVVar6->pArray = local_68;
              pVVar15 = local_68 + (int)uVar4;
              uVar12 = 0x10;
              uVar4 = 0x10 - uVar4;
            }
            else {
              uVar12 = uVar4 * 2;
              if (local_68 == (Vec_Int_t *)0x0) {
                local_68 = (Vec_Int_t *)malloc((ulong)uVar12 << 4);
              }
              else {
                local_68 = (Vec_Int_t *)realloc(local_68,(ulong)uVar12 << 4);
              }
              pVVar6->pArray = local_68;
              pVVar15 = local_68 + uVar4;
            }
            memset(pVVar15,0,(ulong)uVar4 << 4);
            uVar4 = uVar12;
          }
          uVar11 = uVar11 + 1;
          if ((int)uVar17 < 0) {
            pVVar6->nSize = uVar11;
            pVVar6->nCap = uVar4;
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar15 = local_68 + ((ulong)uVar11 - 1);
          if (pVVar15->nCap < iVar2 + 2) {
            if (local_68[(ulong)uVar11 - 1].pArray == (int *)0x0) {
              piVar8 = (int *)malloc(__size);
            }
            else {
              piVar8 = (int *)realloc(local_68[(ulong)uVar11 - 1].pArray,__size);
            }
            local_68[(ulong)uVar11 - 1].pArray = piVar8;
            if (piVar8 == (int *)0x0) {
              pVVar6->nSize = uVar11;
              pVVar6->nCap = uVar4;
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar15->nCap = iVar2 + 2;
          }
          if (0 < (pAVar13->vFanins).nSize) {
            iVar3 = 1;
            lVar14 = 0;
            do {
              puVar9 = (undefined8 *)pAVar13->pNtk->vObjs->pArray[(pAVar13->vFanins).pArray[lVar14]]
              ;
              if (*(int *)*puVar9 == 1) {
                puVar9 = *(undefined8 **)
                          (*(long *)(*(long *)((int *)*puVar9 + 8) + 8) +
                          (long)*(int *)puVar9[4] * 8);
              }
              if (iVar2 <= *(int *)(puVar9 + 8)) {
                pVVar6->nSize = uVar11;
                pVVar6->nCap = uVar4;
                __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nIns",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                              ,0x3e6,"Vec_Wec_t *Abc_ExorcismNtk2Esop(Abc_Ntk_t *)");
              }
              if (pcVar18[lVar14] == '1') {
                Entry = (int)lVar14 * 2;
LAB_0034c8c7:
                Vec_IntPush(pVVar15,Entry);
              }
              else {
                Entry = iVar3;
                if (pcVar18[lVar14] == '0') goto LAB_0034c8c7;
              }
              lVar14 = lVar14 + 1;
              iVar3 = iVar3 + 2;
            } while (lVar14 < (pAVar13->vFanins).nSize);
          }
          Vec_IntPush(pVVar15,~(uint)lVar16);
          pcVar1 = pcVar18 + lVar10;
          pcVar18 = pcVar18 + lVar10;
        } while (*pcVar1 != '\0');
        pVVar6->nSize = uVar11;
        pVVar6->nCap = uVar4;
        uVar17 = uVar11;
      }
      lVar16 = lVar16 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar16 < pVVar7->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vEsop = NULL;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCube;
    int nIns, nOuts, nProducts, nFanins, i, k;

    nIns = Abc_NtkCiNum( pNtk );
    nOuts = Abc_NtkCoNum( pNtk );

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    vEsop = Vec_WecAlloc( nProducts+1 );

    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( Abc_NodeIsConst(pDriver) ) continue;

        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Vec_Int_t *vCubeIn = Vec_WecPushLevel( vEsop );
            Vec_IntGrow( vCubeIn, nIns+2 );

            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nIns );
                if ( pCube[k] == '0' )
                {
                    Vec_IntPush( vCubeIn, 2*k + 1 );
                }
                else if ( pCube[k] == '1' )
                {
                    Vec_IntPush( vCubeIn, 2*k );
                }
            }
            Vec_IntPush( vCubeIn, -( i + 1 ) );
        }
    }

    return vEsop;
}